

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,3>,tcu::Vector<float,3>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  float fVar2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_3>_> *pVVar5;
  pointer pcVar6;
  Variable<float> *pVVar7;
  _func_int **pp_Var8;
  double dVar9;
  FloatFormat *fmt;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  ContextType type;
  int iVar13;
  _Rb_tree_node_base *p_Var14;
  char *pcVar15;
  size_t sVar16;
  long *plVar17;
  ShaderExecutor *pSVar18;
  long lVar19;
  IVal *pIVar20;
  IVal *pIVar21;
  TestError *this_00;
  uint uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  Vector<float,_3> *val;
  float *value;
  MessageBuilder *pMVar24;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  *pVVar25;
  byte bVar26;
  IVal in2;
  IVal in1;
  IVal in3;
  ostringstream os;
  FuncSet funcs;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 local_558 [12];
  undefined4 uStack_54c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  *local_538;
  pointer local_530;
  long local_528;
  undefined1 local_520 [16];
  IVal local_510;
  size_t local_4c8;
  Statement *local_4c0;
  ulong local_4b8;
  string local_4b0;
  ResultCollector *local_490;
  undefined1 local_488 [8];
  _func_int **pp_Stack_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  double local_468;
  Data local_460;
  undefined4 local_450;
  ios_base local_418 [8];
  ios_base local_410 [256];
  undefined1 auStack_310 [8];
  undefined8 uStack_308;
  undefined1 local_300 [16];
  _Base_ptr local_2f0;
  _Rb_tree_node_base *local_2e8;
  _Rb_tree_node_base *local_2e0;
  double local_2d8;
  FloatFormat local_2b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_290;
  pointer local_260;
  FloatFormat *local_258;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar26 = 0;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4c8 = ((long)pVVar4 - (long)pVVar3 >> 2) * -0x5555555555555555;
  local_538 = variables;
  local_510.m_data[2].m_hi = (double)inputs;
  local_4c0 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  ::Outputs(&local_250,local_4c8);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_290._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_290._M_impl.super__Rb_tree_header._M_header;
  local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_488 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_290._M_impl.super__Rb_tree_header._M_header._M_right =
       local_290._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_480);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"Statement: ",0xb);
  (*local_4c0->_vptr_Statement[2])(local_4c0,(ostringstream *)&pp_Stack_480);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_480);
  std::ios_base::~ios_base(local_410);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_300 + 8);
  local_300._8_4_ = _S_red;
  local_2f0 = (_Base_ptr)0x0;
  local_2d8 = 0.0;
  local_530 = pVVar3;
  local_2e8 = p_Var1;
  local_2e0 = p_Var1;
  (*local_4c0->_vptr_Statement[4])(local_4c0,local_300);
  if (local_2e8 != p_Var1) {
    p_Var14 = local_2e8;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var1);
  }
  if (local_2d8 != 0.0) {
    local_488 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_480);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_480,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_480,(char *)local_520._0_8_,local_520._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
      operator_delete((void *)local_520._0_8_,local_510.m_data[0]._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_480);
    std::ios_base::~ios_base(local_410);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_300);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"precision ",10);
  pcVar15 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)local_558 + (int)*(undefined8 *)((long)local_488 + -0x18) + 0xd0);
  }
  else {
    sVar16 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,pcVar15,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar25 = local_538;
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar17 = (long *)std::__cxx11::string::append(local_1a8);
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar23) {
      local_478._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_478._8_8_ = plVar17[3];
      local_488 = (undefined1  [8])&local_478;
    }
    else {
      local_478._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_488 = (undefined1  [8])*plVar17;
    }
    pp_Stack_480 = (_func_int **)plVar17[1];
    *plVar17 = (long)paVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_488);
    if (local_488 != (undefined1  [8])&local_478) {
      operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
    }
    pVVar25 = local_538;
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),2);
  makeSymbol<float>((Symbol *)local_488,this,
                    (pVVar25->in1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar10 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_488);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x38))->varType,(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  pVVar25 = local_538;
  if (local_488 != (undefined1  [8])&local_478) {
    operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_488,this,
             (pVVar25->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar10 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_488);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  if (local_488 != (undefined1  [8])&local_478) {
    operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_488,this,
             (local_538->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_488);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x38))->varType,(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  pVVar25 = local_538;
  if (local_488 != (undefined1  [8])&local_478) {
    operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_488,this,
             (pVVar25->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_488);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  if (local_488 != (undefined1  [8])&local_478) {
    operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  (*local_4c0->_vptr_Statement[2])(local_4c0,local_488);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar18 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_488 = (undefined1  [8])
              (((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               local_510.m_data[2].m_hi)->
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
  pp_Stack_480 = (_func_int **)
                 (((vector<float,_std::allocator<float>_> *)((long)local_510.m_data[2].m_hi + 0x18))
                 ->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_478._M_allocated_capacity =
       (size_type)
       (((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          *)((long)local_510.m_data[2].m_hi + 0x30))->
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_478._8_8_ =
       (((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          *)((long)local_510.m_data[2].m_hi + 0x48))->
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar18->_vptr_ShaderExecutor[3])
            (pSVar18,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar13 = (*pSVar18->_vptr_ShaderExecutor[2])(pSVar18);
  if ((char)iVar13 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar18->_vptr_ShaderExecutor[5])(pSVar18);
  (*pSVar18->_vptr_ShaderExecutor[6])(pSVar18,local_4c8,local_488,local_1a8);
  local_510.m_data[2].m_lo = (double)this;
  (*pSVar18->_vptr_ShaderExecutor[1])(pSVar18);
  pVVar25 = local_538;
  lVar19 = 0x10;
  do {
    local_4b0.field_2._M_local_buf[lVar19 + 8] = '\0';
    *(undefined8 *)((long)&local_490 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_488 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  lVar19 = 0x10;
  do {
    local_4b0.field_2._M_local_buf[lVar19 + 8] = '\0';
    *(undefined8 *)((long)&local_490 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_488 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  local_520._0_8_ = local_520._0_8_ & 0xffffffffffffff00;
  local_520._8_8_ = INFINITY;
  local_510.m_data[0]._0_8_ = -INFINITY;
  lVar19 = 0x10;
  do {
    local_1b8._M_local_buf[lVar19] = '\0';
    *(undefined8 *)(local_1a8 + lVar19 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  lVar19 = 0x10;
  do {
    local_1b8._M_local_buf[lVar19] = '\0';
    *(undefined8 *)(local_1a8 + lVar19 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  lVar19 = 0x10;
  do {
    auStack_310[lVar19] = 0;
    *(undefined8 *)((long)&uStack_308 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_300 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  lVar19 = 0x10;
  do {
    auStack_310[lVar19] = 0;
    *(undefined8 *)((long)&uStack_308 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_300 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_290,
             (local_538->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_488);
  Environment::bind<float>
            ((Environment *)&local_290,
             (pVVar25->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_520);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_290,
             (pVVar25->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_558);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_290,
             (pVVar25->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4b0);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_290,
             (pVVar25->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_290,
             (pVVar25->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_300);
  if (pVVar4 == local_530) {
    local_4b8 = 0;
  }
  else {
    local_490 = (ResultCollector *)((long)local_510.m_data[2].m_lo + 0x100);
    local_260 = (pointer)(local_4c8 + (local_4c8 == 0));
    local_530 = (pointer)0x0;
    local_4b8 = 0;
    local_258 = &(this->m_ctx).floatFormat;
    do {
      lVar19 = 0x10;
      do {
        local_1b8._M_local_buf[lVar19] = '\0';
        *(undefined8 *)(local_1a8 + lVar19 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar19) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x58);
      lVar19 = 0x10;
      do {
        local_1b8._M_local_buf[lVar19] = '\0';
        *(undefined8 *)(local_1a8 + lVar19 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar19) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x58);
      lVar19 = 0x10;
      do {
        auStack_310[lVar19] = 0;
        *(undefined8 *)((long)&uStack_308 + lVar19) = 0x7ff0000000000000;
        *(undefined8 *)(local_300 + lVar19) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x58);
      lVar19 = 0x10;
      do {
        auStack_310[lVar19] = 0;
        *(undefined8 *)((long)&uStack_308 + lVar19) = 0x7ff0000000000000;
        *(undefined8 *)(local_300 + lVar19) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x58);
      if (((ulong)local_530 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog
                  ((((TestCase *)local_510.m_data[2].m_lo)->super_TestNode).m_testCtx);
      }
      fmt = local_258;
      pVVar3 = (((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                local_510.m_data[2].m_hi)->
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_528 = (long)local_530 * 3;
      local_558._8_4_ = pVVar3[(long)local_530].m_data[2];
      local_558._0_8_ = *(undefined8 *)pVVar3[(long)local_530].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_520,local_258,(Vector<float,_3> *)local_558);
      pVVar25 = local_538;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_488,fmt,(IVal *)local_520);
      pIVar20 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_290,
                           (pVVar25->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar24 = (MessageBuilder *)local_488;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(TestLog **)pIVar20->m_data = pMVar24->m_log;
        pMVar24 = (MessageBuilder *)((long)pMVar24 + (ulong)bVar26 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      fVar2 = (((vector<float,_std::allocator<float>_> *)((long)local_510.m_data[2].m_hi + 0x18))->
              super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
              _M_start[(long)local_530];
      pp_Var8 = (_func_int **)(double)fVar2;
      bVar11 = NAN(fVar2);
      local_488[0] = bVar11;
      pp_Stack_480 = (_func_int **)0x7ff0000000000000;
      if (!bVar11) {
        pp_Stack_480 = pp_Var8;
      }
      local_478._M_allocated_capacity = (size_type)(_func_int **)0xfff0000000000000;
      if (!bVar11) {
        local_478._M_allocated_capacity = (size_type)pp_Var8;
      }
      tcu::FloatFormat::roundOut((Interval *)local_558,fmt,(Interval *)local_488,false);
      tcu::FloatFormat::convert((Interval *)local_520,fmt,(Interval *)local_558);
      pIVar21 = Environment::lookup<float>
                          ((Environment *)&local_290,
                           (pVVar25->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar21->m_hi = (double)local_510.m_data[0]._0_8_;
      *(undefined8 *)pIVar21 = local_520._0_8_;
      pIVar21->m_lo = (double)local_520._8_8_;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_290,
                 (pVVar25->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_290,
                 (pVVar25->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_460.basic.type = ((Context *)((long)local_510.m_data[2].m_lo + 0x70))->precision;
      local_468 = fmt->m_maxValue;
      local_488 = *(undefined1 (*) [8])fmt;
      pp_Stack_480 = *(_func_int ***)&fmt->m_fractionBits;
      local_478._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_478._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_450 = 0;
      local_460._8_8_ = &local_290;
      (*local_4c0->_vptr_Statement[3])(local_4c0,(MessageBuilder *)local_488);
      pIVar20 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_290,
                           (pVVar25->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_488,&local_2b8,pIVar20);
      pMVar24 = (MessageBuilder *)local_488;
      pIVar20 = (IVal *)local_300;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(TestLog **)pIVar20->m_data = pMVar24->m_log;
        pMVar24 = (MessageBuilder *)((long)pMVar24 + (ulong)bVar26 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      value = (local_250.out1.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + local_528;
      local_528 = local_528 * 4;
      bVar11 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         ((IVal *)local_300,(Vector<float,_3> *)value);
      local_488 = (undefined1  [8])&local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"Shader output 1 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_490,bVar11,(string *)local_488);
      if (local_488 != (undefined1  [8])&local_478) {
        operator_delete((void *)local_488,(ulong)(local_478._M_allocated_capacity + 1));
      }
      pIVar20 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_290,
                           (local_538->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_488,&local_2b8,pIVar20);
      pMVar24 = (MessageBuilder *)local_488;
      pIVar20 = (IVal *)local_1a8;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(TestLog **)pIVar20->m_data = pMVar24->m_log;
        pMVar24 = (MessageBuilder *)((long)pMVar24 + (ulong)bVar26 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      bVar12 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         ((IVal *)local_1a8,
                          (Vector<float,_3> *)
                          ((long)(local_250.out0.
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + local_528));
      local_488 = (undefined1  [8])&local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"Shader output 0 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(local_490,bVar12,(string *)local_488);
      if (local_488 != (undefined1  [8])&local_478) {
        operator_delete((void *)local_488,(ulong)(local_478._M_allocated_capacity + 1));
      }
      uVar22 = (int)local_4b8 + ((byte)~(bVar11 && bVar12) & 1);
      local_4b8 = (ulong)uVar22;
      if ((int)uVar22 < 0x65 && (!bVar11 || !bVar12)) {
        local_488 = (undefined1  [8])
                    ((((TestCase *)local_510.m_data[2].m_lo)->super_TestNode).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_480);
        pcVar15 = "Failed";
        if (bVar11 && bVar12) {
          pcVar15 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,pcVar15,6);
        pVVar25 = local_538;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\t",1);
        pVVar5 = (pVVar25->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        val = (Vector<float,_3> *)(local_520 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_520._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,(char *)local_520._0_8_,local_520._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_558,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)((((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_510.m_data[2].m_hi)->
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->m_data + local_528),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,(char *)local_558._0_8_,
                   CONCAT44(uStack_54c,local_558._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._0_8_ != &local_548) {
          operator_delete((void *)local_558._0_8_,local_548._M_allocated_capacity + 1);
        }
        if ((Vector<float,_3> *)local_520._0_8_ != (Vector<float,_3> *)(local_520 + 0x10)) {
          operator_delete((void *)local_520._0_8_,local_510.m_data[0]._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\t",1);
        pVVar7 = (pVVar25->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_520._0_8_ = local_520 + 0x10;
        pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,(char *)local_520._0_8_,local_520._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480," = ",3);
        valueToString<float>
                  ((string *)local_558,&local_2b8,
                   (((vector<float,_std::allocator<float>_> *)
                    ((long)local_510.m_data[2].m_hi + 0x18))->
                   super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start + (long)local_530);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,(char *)local_558._0_8_,
                   CONCAT44(uStack_54c,local_558._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._0_8_ != &local_548) {
          operator_delete((void *)local_558._0_8_,local_548._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
          operator_delete((void *)local_520._0_8_,local_510.m_data[0]._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\t",1);
        pVVar5 = (pVVar25->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        pIVar20 = (IVal *)(local_520 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_520._0_8_ = pIVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,(char *)local_520._0_8_,local_520._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_558,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)(local_250.out0.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_528),
                   (Vector<float,_3> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,(char *)local_558._0_8_,
                   CONCAT44(uStack_54c,local_558._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,3>>
                  (&local_4b0,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_1a8,pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._0_8_ != &local_548) {
          operator_delete((void *)local_558._0_8_,local_548._M_allocated_capacity + 1);
        }
        if ((IVal *)local_520._0_8_ != (IVal *)(local_520 + 0x10)) {
          operator_delete((void *)local_520._0_8_,local_510.m_data[0]._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\t",1);
        pVVar5 = (pVVar25->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        pIVar20 = (IVal *)(local_520 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_520._0_8_ = pIVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_520,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,(char *)local_520._0_8_,local_520._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_558,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)(local_250.out1.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_528),
                   (Vector<float,_3> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,(char *)local_558._0_8_,
                   CONCAT44(uStack_54c,local_558._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,3>>
                  (&local_4b0,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_300,pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_480,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._0_8_ != &local_548) {
          operator_delete((void *)local_558._0_8_,local_548._M_allocated_capacity + 1);
        }
        if ((IVal *)local_520._0_8_ != (IVal *)(local_520 + 0x10)) {
          operator_delete((void *)local_520._0_8_,local_510.m_data[0]._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_480);
        std::ios_base::~ios_base(local_410);
      }
      local_530 = (pointer)((long)local_530->m_data + 1);
    } while (local_530 != local_260);
  }
  dVar9 = local_510.m_data[2].m_lo;
  iVar13 = (int)local_4b8;
  if (100 < iVar13) {
    local_488 = (undefined1  [8])
                ((((TestCase *)local_510.m_data[2].m_lo)->super_TestNode).m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_480);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"(Skipped ",9);
    std::ostream::operator<<((ostringstream *)&pp_Stack_480,iVar13 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_480);
    std::ios_base::~ios_base(local_410);
  }
  if (iVar13 == 0) {
    local_488 = (undefined1  [8])((((TestCase *)dVar9)->super_TestNode).m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_480);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_480);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_480," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_488 = (undefined1  [8])((((TestCase *)dVar9)->super_TestNode).m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_480);
    std::ostream::operator<<((ostringstream *)&pp_Stack_480,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_480,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_480);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_480," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_480);
  std::ios_base::~ios_base(local_410);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}